

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall
ImVector<ImGuiListClipperRange>::push_front
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  int *piVar1;
  ImGuiListClipperRange *pIVar2;
  ImS8 IVar3;
  ImS8 IVar4;
  undefined1 uVar5;
  uint uVar6;
  ImGuiListClipperRange *pIVar7;
  long lVar8;
  int iVar9;
  
  uVar6 = this->Size;
  if (uVar6 == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiListClipperRange *)(*GImAllocatorAllocFunc)(0x60,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar7,this->Data,(long)this->Size * 0xc);
        pIVar2 = this->Data;
        if ((pIVar2 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      this->Data = pIVar7;
      this->Capacity = 8;
      lVar8 = (long)this->Size;
    }
    else {
      pIVar7 = this->Data;
      lVar8 = 0;
    }
    pIVar7 = pIVar7 + lVar8;
  }
  else {
    if (uVar6 == this->Capacity) {
      iVar9 = (int)uVar6 / 2 + uVar6;
      if (iVar9 <= (int)(uVar6 + 1)) {
        iVar9 = uVar6 + 1;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiListClipperRange *)
               (*GImAllocatorAllocFunc)((long)iVar9 * 0xc,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar7,this->Data,(long)this->Size * 0xc);
        pIVar2 = this->Data;
        if ((pIVar2 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      this->Data = pIVar7;
      this->Capacity = iVar9;
      uVar6 = this->Size;
    }
    else {
      pIVar7 = this->Data;
    }
    if (0 < (int)uVar6) {
      memmove(pIVar7 + 1,pIVar7,(ulong)uVar6 * 0xc);
      pIVar7 = this->Data;
    }
  }
  IVar3 = v->PosToIndexOffsetMin;
  IVar4 = v->PosToIndexOffsetMax;
  uVar5 = v->field_0xb;
  pIVar7->PosToIndexConvert = v->PosToIndexConvert;
  pIVar7->PosToIndexOffsetMin = IVar3;
  pIVar7->PosToIndexOffsetMax = IVar4;
  pIVar7->field_0xb = uVar5;
  iVar9 = v->Max;
  pIVar7->Min = v->Min;
  pIVar7->Max = iVar9;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }